

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestAllTypes * __thiscall
proto2_unittest::NestedTestAllTypes::_internal_mutable_eager_child(NestedTestAllTypes *this)

{
  TestAllTypes *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.eager_child_;
  if (pTVar1 != (TestAllTypes *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestAllTypes *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestAllTypes>(arena);
  (this->field_0)._impl_.eager_child_ = pTVar1;
  return pTVar1;
}

Assistant:

NestedTestAllTypes::_internal_mutable_eager_child() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.eager_child_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestAllTypes>(GetArena());
    _impl_.eager_child_ = reinterpret_cast<::proto2_unittest::TestAllTypes*>(p);
  }
  return _impl_.eager_child_;
}